

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O0

void cppurses::System::post_event<cppurses::Resize_event,cppurses::Widget&,cppurses::Area>
               (Widget *args,Area *args_1)

{
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> local_28;
  undefined1 local_20 [8];
  __single_object event;
  Area *args_local_1;
  Widget *args_local;
  
  event._M_t.
  super___uniq_ptr_impl<cppurses::Resize_event,_std::default_delete<cppurses::Resize_event>_>._M_t.
  super__Tuple_impl<0UL,_cppurses::Resize_event_*,_std::default_delete<cppurses::Resize_event>_>.
  super__Head_base<0UL,_cppurses::Resize_event_*,_false>._M_head_impl =
       (__uniq_ptr_data<cppurses::Resize_event,_std::default_delete<cppurses::Resize_event>,_true,_true>
        )(__uniq_ptr_data<cppurses::Resize_event,_std::default_delete<cppurses::Resize_event>,_true,_true>
          )args_1;
  std::make_unique<cppurses::Resize_event,cppurses::Widget&,cppurses::Area>
            ((Widget *)local_20,(Area *)args);
  std::unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>>::
  unique_ptr<cppurses::Resize_event,std::default_delete<cppurses::Resize_event>,void>
            ((unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>> *)&local_28,
             (unique_ptr<cppurses::Resize_event,_std::default_delete<cppurses::Resize_event>_> *)
             local_20);
  post_event(&local_28);
  std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::~unique_ptr(&local_28);
  std::unique_ptr<cppurses::Resize_event,_std::default_delete<cppurses::Resize_event>_>::~unique_ptr
            ((unique_ptr<cppurses::Resize_event,_std::default_delete<cppurses::Resize_event>_> *)
             local_20);
  return;
}

Assistant:

static void post_event(Args&&... args)
    {
        auto event = std::make_unique<T>(std::forward<Args>(args)...);
        System::post_event(std::move(event));
    }